

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_default_vfs_close(ma_vfs *pVFS,ma_vfs_file file)

{
  ma_vfs_file in_RSI;
  ma_vfs *in_RDI;
  undefined4 local_4;
  
  if (in_RSI == (ma_vfs_file)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    local_4 = ma_default_vfs_close__stdio(in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

static ma_result ma_default_vfs_close(ma_vfs* pVFS, ma_vfs_file file)
{
    if (file == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_close__win32(pVFS, file);
#else
    return ma_default_vfs_close__stdio(pVFS, file);
#endif
}